

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O1

light_pcapng_file_info *
light_create_file_info(char *os_desc,char *hardware_desc,char *user_app_desc,char *file_comment)

{
  light_pcapng_file_info *__s;
  size_t sVar1;
  char *pcVar2;
  size_t os_len;
  size_t app_len;
  size_t hw_len;
  size_t comment_len;
  
  __s = (light_pcapng_file_info *)calloc(1,400);
  memset(__s,0,400);
  __s->major_version = 1;
  if (os_desc != (char *)0x0) {
    sVar1 = strlen(os_desc);
    if (sVar1 != 0) {
      pcVar2 = (char *)calloc(sVar1,1);
      __s->os_desc = pcVar2;
      memcpy(pcVar2,os_desc,sVar1);
      __s->os_desc_size = sVar1;
    }
  }
  if (hardware_desc != (char *)0x0) {
    sVar1 = strlen(hardware_desc);
    if (sVar1 != 0) {
      pcVar2 = (char *)calloc(sVar1,1);
      __s->hardware_desc = pcVar2;
      memcpy(pcVar2,hardware_desc,sVar1);
      __s->hardware_desc_size = sVar1;
    }
  }
  if (user_app_desc != (char *)0x0) {
    sVar1 = strlen(user_app_desc);
    if (sVar1 != 0) {
      pcVar2 = (char *)calloc(sVar1,1);
      __s->user_app_desc = pcVar2;
      memcpy(pcVar2,user_app_desc,sVar1);
      __s->user_app_desc_size = sVar1;
    }
  }
  if (file_comment != (char *)0x0) {
    sVar1 = strlen(file_comment);
    if (sVar1 != 0) {
      pcVar2 = (char *)calloc(sVar1,1);
      __s->file_comment = pcVar2;
      memcpy(pcVar2,file_comment,sVar1);
      __s->file_comment_size = sVar1;
    }
  }
  return __s;
}

Assistant:

light_pcapng_file_info *light_create_file_info(const char *os_desc, const char *hardware_desc, const char *user_app_desc, const char *file_comment)
{
	light_pcapng_file_info *info = light_create_default_file_info();

	if (os_desc != NULL && strlen(os_desc) > 0)
	{
		size_t os_len = strlen(os_desc);
		info->os_desc = calloc(os_len, sizeof(char));
		memcpy(info->os_desc, os_desc, os_len);
		info->os_desc_size = os_len;
	}

	if (hardware_desc != NULL && strlen(hardware_desc) > 0)
	{
		size_t hw_len = strlen(hardware_desc);
		info->hardware_desc = calloc(hw_len, sizeof(char));
		memcpy(info->hardware_desc, hardware_desc, hw_len);
		info->hardware_desc_size = hw_len;
	}

	if (user_app_desc != NULL && strlen(user_app_desc) > 0)
	{
		size_t app_len = strlen(user_app_desc);
		info->user_app_desc = calloc(app_len, sizeof(char));
		memcpy(info->user_app_desc, user_app_desc, app_len);
		info->user_app_desc_size = app_len;
	}

	if (file_comment != NULL && strlen(file_comment) > 0)
	{
		size_t comment_len = strlen(file_comment);
		info->file_comment = calloc(comment_len, sizeof(char));
		memcpy(info->file_comment, file_comment, comment_len);
		info->file_comment_size = comment_len;
	}

	return info;
}